

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcrcell.c
# Opt level: O2

void freelistcell(LispPTR cell)

{
  uint uVar1;
  DLword *pDVar2;
  dtd *pdVar3;
  byte bVar4;
  LispPTR *pLVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  pLVar5 = NativeAligned4FromLAddr(cell);
  pDVar2 = Lisp_world;
  uVar9 = cell >> 8 & 0xfffff;
  uVar10 = uVar9 << 9;
  uVar8 = (uint)((ulong)cell & 0xff);
  if (uVar8 < 8) {
    error("freeing CONS cell that\'s really freelist ptr");
  }
  uVar1 = *(uint *)((long)pDVar2 + (ulong)uVar10 + 8);
  if (uVar1 < 0x1000000) {
    *(uint *)((long)pDVar2 + (ulong)uVar10 + 8) = uVar1 & 0xffff | uVar8 << 0x10;
    *(undefined1 *)((long)pDVar2 + ((ulong)cell & 0xff) * 2 + (ulong)uVar10 + 3) = 0;
  }
  else {
    uVar7 = 0;
    for (uVar6 = uVar1 >> 0x10 & 0xff; (uVar6 != 0 && ((uVar8 ^ 6) <= (uVar6 ^ 6)));
        uVar6 = (uint)*(byte *)((long)pDVar2 + (ulong)uVar6 * 2 + (ulong)uVar10 + 3)) {
      uVar7 = (ulong)uVar6;
    }
    if ((int)uVar7 == 0) {
      *(uint *)((long)pDVar2 + (ulong)uVar10 + 8) = uVar1 & 0xff00ffff | uVar8 << 0x10;
    }
    else {
      *(char *)((long)pDVar2 + uVar7 * 2 + (ulong)uVar10 + 3) = (char)cell;
    }
    *(char *)((long)pLVar5 + 3) = (char)uVar6;
  }
  bVar4 = *(char *)((long)pDVar2 + (ulong)uVar10 + 0xb) + 1;
  *(byte *)((long)pDVar2 + (ulong)uVar10 + 0xb) = bVar4;
  pdVar3 = ListpDTD;
  if ((0x20 < bVar4) && (*(int *)((long)pDVar2 + (ulong)uVar10 + 0xc) == -1)) {
    *(LispPTR *)((long)pDVar2 + (ulong)uVar10 + 0xc) = ListpDTD->dtd_nextpage;
    pdVar3->dtd_nextpage = uVar9;
  }
  return;
}

Assistant:

void freelistcell(LispPTR cell) {
  struct conspage *pbase;
  ConsCell *cell68k;
  unsigned int offset, prior, celloffset;

  cell68k = (ConsCell *)NativeAligned4FromLAddr(cell);
  pbase = (struct conspage *)NativeAligned4FromLPage(POINTER_PAGE(cell));
  celloffset = (LispPTR)cell & 0xFF;
#ifdef NEWCDRCODING
  if (celloffset < 8) error("freeing CONS cell that's really freelist ptr");
#endif /* NEWCDRCODING */

  if (pbase->count) /* There are free cells on the page already */
  {
    prior = 0;

    for (offset = pbase->next_cell; offset; offset = FREECONS(pbase, offset)->next_free) {
#ifdef NEWCDRCODING
      if ((6 ^ offset) < (6 ^ celloffset))
#else
      if (offset < celloffset)
#endif /* NEWCDRCODING */
      {
        break;
      }
      prior = offset;
    }

    if (prior)
      FREECONS(pbase, prior)->next_free = celloffset;
    else
      pbase->next_cell = celloffset;
    ((freecons *)cell68k)->next_free = offset;
  } else /* NO FREE CELLS.  Just replace next_free. */
  {
    pbase->next_cell = celloffset;
    FREECONS(pbase, celloffset)->next_free = 0; /* And this is end of the chain */
  }

  if ((++pbase->count > 32) && (pbase->next_page == CONSPAGE_LAST)) {
    pbase->next_page = ListpDTD->dtd_nextpage;
    ListpDTD->dtd_nextpage = POINTER_PAGE(cell);
  }
}